

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O2

void sha512_Update(SHA512_CTX *context,sha2_byte *data,size_t len)

{
  uint64_t *puVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  void *__dest;
  ulong uVar6;
  bool bVar7;
  
  if (len == 0) {
    return;
  }
  uVar3 = (uint)context->bitcount[0] >> 3 & 0x7f;
  if (uVar3 != 0) {
    uVar6 = (ulong)(0x80 - uVar3);
    __dest = (void *)((long)context->buffer + (ulong)uVar3);
    if (len < uVar6) {
      memcpy(__dest,data,len);
      puVar1 = context->bitcount;
      bVar7 = CARRY8(*puVar1,len * 8);
      *puVar1 = *puVar1 + len * 8;
      goto joined_r0x0010d7b9;
    }
    memcpy(__dest,data,uVar6);
    uVar4 = (ulong)((0x80 - uVar3) * 8);
    puVar1 = context->bitcount;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar4;
    if (CARRY8(uVar2,uVar4)) {
      context->bitcount[1] = context->bitcount[1] + 1;
    }
    for (lVar5 = 10; lVar5 != 0x1a; lVar5 = lVar5 + 1) {
      uVar2 = context->state[lVar5];
      context->state[lVar5] =
           uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
           (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
           (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    }
    data = data + uVar6;
    sha512_Transform(context->state,context->buffer,context->state);
    len = len - uVar6;
  }
  puVar1 = context->buffer;
  for (; 0x7f < len; len = len - 0x80) {
    memcpy(puVar1,data,0x80);
    for (lVar5 = 10; lVar5 != 0x1a; lVar5 = lVar5 + 1) {
      uVar6 = context->state[lVar5];
      context->state[lVar5] =
           uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
           (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
           (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
    }
    sha512_Transform(context->state,puVar1,context->state);
    uVar6 = context->bitcount[0];
    context->bitcount[0] = uVar6 + 0x400;
    if (0xfffffffffffffbff < uVar6) {
      context->bitcount[1] = context->bitcount[1] + 1;
    }
    data = data + 0x80;
  }
  if (len == 0) {
    return;
  }
  memcpy(puVar1,data,len);
  puVar1 = context->bitcount;
  bVar7 = CARRY8(*puVar1,len * 8);
  *puVar1 = *puVar1 + len * 8;
joined_r0x0010d7b9:
  if (bVar7) {
    context->bitcount[1] = context->bitcount[1] + 1;
  }
  return;
}

Assistant:

void sha512_Update(trezor::SHA512_CTX* context, const sha2_byte *data, size_t len) {
	unsigned int	freespace, usedspace;

	if (len == 0) {
		/* Calling with no data is valid - we do nothing */
		return;
	}

	usedspace = (context->bitcount[0] >> 3) % SHA512_BLOCK_LENGTH;
	if (usedspace > 0) {
		/* Calculate how much free space is available in the buffer */
		freespace = SHA512_BLOCK_LENGTH - usedspace;

		if (len >= freespace) {
			/* Fill the buffer completely and process it */
			MEMCPY_BCOPY(((uint8_t*)context->buffer) + usedspace, data, freespace);
			ADDINC128(context->bitcount, freespace << 3);
			len -= freespace;
			data += freespace;
#if BYTE_ORDER == LITTLE_ENDIAN
			/* Convert TO host byte order */
			for (int j = 0; j < 16; j++) {
				REVERSE64(context->buffer[j],context->buffer[j]);
			}
#endif
			sha512_Transform(context->state, context->buffer, context->state);
		} else {
			/* The buffer is not yet full */
			MEMCPY_BCOPY(((uint8_t*)context->buffer) + usedspace, data, len);
			ADDINC128(context->bitcount, len << 3);
			/* Clean up: */
			usedspace = freespace = 0;
			return;
		}
	}
	while (len >= SHA512_BLOCK_LENGTH) {
		/* Process as many complete blocks as we can */
		MEMCPY_BCOPY(context->buffer, data, SHA512_BLOCK_LENGTH);
#if BYTE_ORDER == LITTLE_ENDIAN
		/* Convert TO host byte order */
		for (int j = 0; j < 16; j++) {
			REVERSE64(context->buffer[j],context->buffer[j]);
		}
#endif
		sha512_Transform(context->state, context->buffer, context->state);
		ADDINC128(context->bitcount, SHA512_BLOCK_LENGTH << 3);
		len -= SHA512_BLOCK_LENGTH;
		data += SHA512_BLOCK_LENGTH;
	}
	if (len > 0) {
		/* There's left-overs, so save 'em */
		MEMCPY_BCOPY(context->buffer, data, len);
		ADDINC128(context->bitcount, len << 3);
	}
}